

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void __thiscall
boost::deflate::deflate_stream_test::testFlushAtLiteralBufferFull(boost::deflate::
deflate_stream_test::ICompressor&)::fixture::fixture(boost::deflate::deflate_stream_test::
ICompressor&,unsigned_long,boost::deflate::Strategy_(void *this,ICompressor *c,size_t n,Strategy s)

{
  long lVar1;
  
  *(ICompressor **)this = c;
  *(long *)((long)this + 0x108) = (long)this + 0x118;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined1 *)((long)this + 0x118) = 0;
  (*c->_vptr_ICompressor[1])(c,8,0xf,1,(ulong)s);
  for (lVar1 = 0; lVar1 != 0xff; lVar1 = lVar1 + 1) {
    *(char *)((long)this + lVar1 + 8) = (char)lVar1;
  }
  std::__cxx11::string::resize((long)this + 0x108);
  (*c->_vptr_ICompressor[5])(c,(long)this + 8);
  (*c->_vptr_ICompressor[3])(c,0xff);
  (*c->_vptr_ICompressor[9])(c,*(undefined8 *)((long)this + 0x108));
  (*c->_vptr_ICompressor[7])(c,*(undefined8 *)((long)this + 0x110));
  return;
}

Assistant:

explicit fixture(ICompressor&c, std::size_t n, Strategy s) : c(c)
            {
                c.init(8, 15, 1, static_cast<int>(s));
                std::iota(in.begin(), in.end(), std::uint8_t{0});
                out.resize(n);
                c.next_in(in.data());
                c.avail_in(in.size());
                c.next_out(&out.front());
                c.avail_out(out.size());
            }